

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QList<int> * __thiscall
QDockAreaLayout::gapIndex
          (QList<int> *__return_storage_ptr__,QDockAreaLayout *this,QPoint *pos,bool disallowTabs)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  DockOptions DVar4;
  undefined7 in_register_00000009;
  QDockAreaLayoutInfo *this_00;
  qsizetype *pqVar5;
  TabMode tabMode;
  DockPosition dockPos;
  long lVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_68;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  DVar4 = QMainWindow::dockOptions(this->mainWindow);
  if ((int)CONCAT71(in_register_00000009,disallowTabs) == 0) {
    tabMode = ForceTabs;
    if (((uint)DVar4.super_QFlagsStorageHelper<QMainWindow::DockOption,_4>.
               super_QFlagsStorage<QMainWindow::DockOption>.i & 8) == 0) {
      tabMode = (TabMode)(((uint)DVar4.super_QFlagsStorageHelper<QMainWindow::DockOption,_4>.
                                 super_QFlagsStorage<QMainWindow::DockOption>.i & 0x14) != 0);
    }
    bVar3 = ((uint)DVar4.super_QFlagsStorageHelper<QMainWindow::DockOption,_4>.
                   super_QFlagsStorage<QMainWindow::DockOption>.i & 10) == 2;
  }
  else {
    bVar3 = SUB41(((uint)DVar4.super_QFlagsStorageHelper<QMainWindow::DockOption,_4>.
                         super_QFlagsStorage<QMainWindow::DockOption>.i & 2) >> 1,0);
    tabMode = NoTabs;
  }
  this_00 = this->docks;
  for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
    bVar1 = QDockAreaLayoutInfo::isEmpty(this_00);
    if ((!bVar1) && (cVar2 = QRect::contains((QPoint *)&this_00->rect,SUB81(pos,0)), cVar2 != '\0'))
    {
      (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
      QDockAreaLayoutInfo::gapIndex(__return_storage_ptr__,this_00,pos,bVar3,tabMode);
      if ((__return_storage_ptr__->d).size == 0) goto LAB_003cd732;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QList<int>::prepend(__return_storage_ptr__,(parameter_type)lVar6);
        return __return_storage_ptr__;
      }
      goto LAB_003cd754;
    }
    this_00 = this_00 + 1;
  }
  pqVar5 = &this->docks[0].item_list.d.size;
  lVar6 = 0;
  do {
    if (lVar6 == 4) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (int *)0x0;
      (__return_storage_ptr__->d).size = 0;
LAB_003cd732:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
LAB_003cd754:
      __stack_chk_fail();
    }
    bVar3 = QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)(pqVar5 + -10));
    if (bVar3) {
      local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      dockPos = (DockPosition)lVar6;
      local_48 = (undefined1  [16])gapRect(this,dockPos);
      cVar2 = QRect::contains((QPoint *)local_48,SUB81(pos,0));
      if (cVar2 != '\0') {
        if ((((uint)DVar4.super_QFlagsStorageHelper<QMainWindow::DockOption,_4>.
                    super_QFlagsStorage<QMainWindow::DockOption>.i & 8) == 0) || (*pqVar5 == 0)) {
          local_68.d = (Data *)0x0;
          local_68.ptr = (int *)0x0;
          local_68.size = 0;
        }
        else {
          local_68.d = (Data *)0x0;
          local_68.ptr = (int *)0x0;
          local_68.size = 0;
          QList<int>::append((QList<int> *)&local_68,dockPos);
          dockPos = ~LeftDock;
        }
        QList<int>::append((QList<int> *)&local_68,dockPos);
        QList<int>::append((QList<int> *)&local_68,0);
        (__return_storage_ptr__->d).d = local_68.d;
        (__return_storage_ptr__->d).ptr = local_68.ptr;
        (__return_storage_ptr__->d).size = local_68.size;
        if (local_68.d != (Data *)0x0) {
          LOCK();
          ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QArrayDataPointer<int>::~QArrayDataPointer(&local_68);
        goto LAB_003cd732;
      }
    }
    lVar6 = lVar6 + 1;
    pqVar5 = pqVar5 + 0xe;
  } while( true );
}

Assistant:

QList<int> QDockAreaLayout::gapIndex(const QPoint &pos, bool disallowTabs) const
{
    QMainWindow::DockOptions opts = mainWindow->dockOptions();
    bool nestingEnabled = opts & QMainWindow::AllowNestedDocks;
    QDockAreaLayoutInfo::TabMode tabMode = QDockAreaLayoutInfo::NoTabs;
#if QT_CONFIG(tabbar)
    if (!disallowTabs) {
        if (opts & QMainWindow::AllowTabbedDocks || opts & QMainWindow::VerticalTabs)
            tabMode = QDockAreaLayoutInfo::AllowTabs;
        if (opts & QMainWindow::ForceTabbedDocks)
            tabMode = QDockAreaLayoutInfo::ForceTabs;

        if (tabMode == QDockAreaLayoutInfo::ForceTabs)
            nestingEnabled = false;
    }
#endif


    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QDockAreaLayoutInfo &info = docks[i];

        if (!info.isEmpty() && info.rect.contains(pos)) {
            QList<int> result
                = docks[i].gapIndex(pos, nestingEnabled, tabMode);
            if (!result.isEmpty())
                result.prepend(i);
            return result;
        }
    }

    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QDockAreaLayoutInfo &info = docks[i];

        if (info.isEmpty()) {
            const QRect r = gapRect(static_cast<QInternal::DockPosition>(i));
            if (r.contains(pos)) {
                if (opts & QMainWindow::ForceTabbedDocks && !info.item_list.isEmpty()) {
                    //in case of ForceTabbedDocks, we pass -1 in order to force the gap to be tabbed
                    //it mustn't be completely empty otherwise it won't work
                    return QList<int>() << i << -1 << 0;
                } else {
                    return QList<int>() << i << 0;
                }
            }
        }
    }

    return QList<int>();
}